

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_window_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundWindowExpression::Copy(BoundWindowExpression *this)

{
  WindowBoundary WVar1;
  WindowExcludeMode WVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> _Var5;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar7;
  element_type *peVar8;
  _func_int **pp_Var9;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  long lVar12;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *puVar13;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var14;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var15;
  pointer pBVar16;
  type pAVar17;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> this_00;
  pointer pFVar18;
  pointer pEVar19;
  long lVar20;
  Expression *in_RSI;
  aggregate_size_t *pp_Var21;
  aggregate_size_t *pp_Var22;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar23;
  element_type *this_01;
  _func_int **__args;
  BaseStatistics *__args_00;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *this_02;
  byte bVar24;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  bool local_38;
  bool bStack_37;
  undefined6 uStack_36;
  
  bVar24 = 0;
  local_50._M_head_impl = (Expression *)0x0;
  local_38 = false;
  bStack_37 = false;
  uStack_36 = 0;
  local_40._M_head_impl = &this->super_Expression;
  make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType_const&,duckdb::LogicalType_const&,decltype(nullptr),decltype(nullptr)>
            ((ExpressionType *)&stack0xffffffffffffffb8,
             (LogicalType *)&(in_RSI->super_BaseExpression).type,(void **)&in_RSI->return_type,
             &stack0xffffffffffffffb0._M_head_impl);
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  Expression::CopyProperties(&pBVar16->super_Expression,in_RSI);
  if (in_RSI[1].super_BaseExpression._vptr_BaseExpression != (_func_int **)0x0) {
    pAVar17 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
              ::operator*((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                           *)(in_RSI + 1));
    this_00._M_head_impl = (AggregateFunction *)operator_new(0x130);
    SimpleFunction::SimpleFunction((SimpleFunction *)this_00._M_head_impl,(SimpleFunction *)pAVar17)
    ;
    *(undefined ***)&(this_00._M_head_impl)->super_BaseScalarFunction =
         &PTR__BaseScalarFunction_02439fe0;
    LogicalType::LogicalType
              ((LogicalType *)&((this_00._M_head_impl)->super_BaseScalarFunction).return_type,
               &(pAVar17->super_BaseScalarFunction).return_type);
    *(undefined4 *)&((this_00._M_head_impl)->super_BaseScalarFunction).stability =
         *(undefined4 *)&(pAVar17->super_BaseScalarFunction).stability;
    *(undefined ***)&(this_00._M_head_impl)->super_BaseScalarFunction =
         &PTR__AggregateFunction_0243cea8;
    pp_Var21 = &pAVar17->state_size;
    pp_Var22 = &(this_00._M_head_impl)->state_size;
    for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
      *pp_Var22 = *pp_Var21;
      pp_Var21 = pp_Var21 + (ulong)bVar24 * -2 + 1;
      pp_Var22 = pp_Var22 + (ulong)bVar24 * -2 + 1;
    }
    *(undefined2 *)
     &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this_00._M_head_impl)->order_dependent)->
      _M_pi = *(undefined2 *)&pAVar17->order_dependent;
    (((SimpleFunction *)&(this_00._M_head_impl)->function_info)->super_Function)._vptr_Function =
         (_func_int **)
         (pAVar17->function_info).internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (pAVar17->function_info).internal.
             super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (((string *)
     &((this_00._M_head_impl)->function_info).internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)->
    _M_dataplus)._M_p = (pointer)p_Var4;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&stack0xffffffffffffffb8);
    _Var5._M_head_impl =
         (pBVar16->aggregate).
         super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
         .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
    (pBVar16->aggregate).
    super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
    .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var5._M_head_impl != (AggregateFunction *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseScalarFunction + 8))();
    }
  }
  lVar20._0_1_ = in_RSI[1].super_BaseExpression.type;
  lVar20._1_1_ = in_RSI[1].super_BaseExpression.expression_class;
  lVar20._2_6_ = *(undefined6 *)&in_RSI[1].super_BaseExpression.field_0xa;
  if (lVar20 != 0) {
    pFVar18 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                          *)&in_RSI[1].super_BaseExpression.type);
    (*pFVar18->_vptr_FunctionData[2])(&stack0xffffffffffffffb0,pFVar18);
    pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&stack0xffffffffffffffb8);
    _Var14._M_head_impl = (FunctionData *)local_50._M_head_impl;
    local_50._M_head_impl = (Expression *)0x0;
    _Var6._M_head_impl =
         (pBVar16->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (pBVar16->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var14._M_head_impl;
    if (_Var6._M_head_impl != (FunctionData *)0x0) {
      (*(_Var6._M_head_impl)->_vptr_FunctionData[1])();
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
  }
  puVar23 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
            in_RSI[1].super_BaseExpression.alias._M_dataplus._M_p;
  puVar7 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           in_RSI[1].super_BaseExpression.alias._M_string_length;
  if (puVar23 != puVar7) {
    do {
      pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar23);
      (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar19);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar16->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar7);
  }
  puVar23 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
             ((long)&in_RSI[1].super_BaseExpression.alias.field_2 + 8);
  puVar7 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           in_RSI[1].super_BaseExpression.query_location.index;
  if (puVar23 != puVar7) {
    do {
      pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar23);
      (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar19);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar16->partitions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar7);
  }
  this_01 = in_RSI[1].return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar8 = (element_type *)
           in_RSI[1].return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != peVar8) {
    do {
      if (this_01->_vptr_ExtraTypeInfo == (_func_int **)0x0) {
        pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        local_50._M_head_impl = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar16->partitions_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      else {
        pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)this_01);
        BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffb0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar16->partitions_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      _Var11._M_head_impl = local_50._M_head_impl;
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_50._M_head_impl);
        operator_delete(_Var11._M_head_impl);
      }
      this_01 = (element_type *)&this_01->type;
    } while (this_01 != peVar8);
  }
  __args = in_RSI[2].super_BaseExpression._vptr_BaseExpression;
  pp_Var9 = *(_func_int ***)&in_RSI[2].super_BaseExpression.type;
  if (__args != pp_Var9) {
    do {
      pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)(__args + 1));
      (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar19);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar16->orders,(OrderType *)__args,(OrderByNullType *)((long)__args + 1),
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      __args = __args + 3;
    } while (__args != pp_Var9);
  }
  __args_00 = (BaseStatistics *)
              in_RSI[2].return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  _Var10._M_head_impl =
       in_RSI[2].verification_stats.
       super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  if (__args_00 != _Var10._M_head_impl) {
    do {
      pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&(__args_00->type).type_info_);
      (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar19);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar16->arg_orders,(OrderType *)__args_00,&(__args_00->type).physical_type_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      __args_00 = (BaseStatistics *)&__args_00->has_null;
    } while (__args_00 != _Var10._M_head_impl);
  }
  if (in_RSI[2].super_BaseExpression.alias._M_string_length == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].super_BaseExpression.alias._M_string_length);
    (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar19);
  }
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar16->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar16->filter_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  WVar1 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[2];
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar16->start = WVar1;
  WVar1 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[3];
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar16->end = WVar1;
  WVar2 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[4];
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar16->exclude_clause = WVar2;
  if (*(long *)((long)&in_RSI[2].super_BaseExpression.alias.field_2 + 8) == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)((long)&in_RSI[2].super_BaseExpression.alias.field_2 + 8));
    (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar19);
  }
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar16->start_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar16->start_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (in_RSI[2].super_BaseExpression.query_location.index == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].super_BaseExpression.query_location);
    (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar19);
  }
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar16->end_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar16->end_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  lVar12._0_1_ = in_RSI[2].return_type.id_;
  lVar12._1_1_ = in_RSI[2].return_type.physical_type_;
  lVar12._2_6_ = *(undefined6 *)&in_RSI[2].return_type.field_0x2;
  if (lVar12 == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].return_type);
    (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar19);
  }
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar16->offset_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar16->offset_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (in_RSI[2].return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].return_type.type_info_);
    (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar19);
  }
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar16->default_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar16->default_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  bVar3 = (bool)in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[0];
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar16->ignore_nulls = bVar3;
  bVar3 = (bool)in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[1];
  pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar16->distinct = bVar3;
  this_02 = *(unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              **)&in_RSI[3].super_BaseExpression.type;
  puVar13 = (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *
            )in_RSI[3].super_BaseExpression.alias._M_dataplus._M_p;
  if (this_02 != puVar13) {
    do {
      if ((this_02->
          super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
          (BaseStatistics *)0x0) {
        pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        local_50._M_head_impl = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar16->expr_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      else {
        pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        operator->(this_02);
        BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffb0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar16->expr_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      _Var11._M_head_impl = local_50._M_head_impl;
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_50._M_head_impl);
        operator_delete(_Var11._M_head_impl);
      }
      this_02 = this_02 + 1;
    } while (this_02 != puVar13);
  }
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl)->_vptr__Sp_counted_base =
       (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_40._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundWindowExpression::Copy() const {
	auto new_window = make_uniq<BoundWindowExpression>(type, return_type, nullptr, nullptr);
	new_window->CopyProperties(*this);

	if (aggregate) {
		new_window->aggregate = make_uniq<AggregateFunction>(*aggregate);
	}
	if (bind_info) {
		new_window->bind_info = bind_info->Copy();
	}
	for (auto &child : children) {
		new_window->children.push_back(child->Copy());
	}
	for (auto &e : partitions) {
		new_window->partitions.push_back(e->Copy());
	}
	for (auto &ps : partitions_stats) {
		if (ps) {
			new_window->partitions_stats.push_back(ps->ToUnique());
		} else {
			new_window->partitions_stats.push_back(nullptr);
		}
	}
	for (auto &o : orders) {
		new_window->orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	for (auto &o : arg_orders) {
		new_window->arg_orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	new_window->filter_expr = filter_expr ? filter_expr->Copy() : nullptr;

	new_window->start = start;
	new_window->end = end;
	new_window->exclude_clause = exclude_clause;
	new_window->start_expr = start_expr ? start_expr->Copy() : nullptr;
	new_window->end_expr = end_expr ? end_expr->Copy() : nullptr;
	new_window->offset_expr = offset_expr ? offset_expr->Copy() : nullptr;
	new_window->default_expr = default_expr ? default_expr->Copy() : nullptr;
	new_window->ignore_nulls = ignore_nulls;
	new_window->distinct = distinct;

	for (auto &es : expr_stats) {
		if (es) {
			new_window->expr_stats.push_back(es->ToUnique());
		} else {
			new_window->expr_stats.push_back(nullptr);
		}
	}
	return std::move(new_window);
}